

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DaTrie<false,_false,_false>::xcheck_
          (DaTrie<false,_false,_false> *this,Edge *edge,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  pointer pBVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  
  if (edge->size_ == 1) {
    uVar4 = this->head_pos_;
    if (uVar4 == 0xffffffff) {
      uVar4 = (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    uVar3 = uVar4 ^ edge->labels_[0];
  }
  else {
    uVar3 = this->head_pos_;
    if (uVar3 == 0xffffffff) {
      uVar3 = (uint)edge->labels_[0] ^
              (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
    }
    else {
      do {
        if (edge->size_ <=
            (ulong)(blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar3 >> 8].num_emps) {
          uVar4 = edge->labels_[0] ^ uVar3;
          bVar2 = is_target_(this,uVar4,edge);
          if (bVar2) {
            return uVar4;
          }
        }
        pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = *(uint *)(pBVar1 + uVar3) & 0x7fffffff;
      } while (uVar3 != this->head_pos_);
      uVar3 = (uint)edge->labels_[0] ^
              (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3);
    }
  }
  return uVar3;
}

Assistant:

uint32_t xcheck_(const Edge& edge, const std::vector<Block>& blocks) const {
    if (edge.size() == 1) {
      return xcheck_(*edge.begin(), blocks);
    }

    if (head_pos_ == NOT_FOUND) {
      return bc_size() ^ *edge.begin();
    }

    auto node_pos = head_pos_;
    do {
      if (blocks[node_pos / BLOCK_SIZE].num_emps < edge.size()) {
        continue;
      }

      auto base = node_pos ^*edge.begin();
      if (is_target_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head_pos_);

    return bc_size() ^ *edge.begin();
  }